

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseNCName(xmlParserCtxtPtr ctxt)

{
  int *piVar1;
  xmlChar **ppxVar2;
  byte bVar3;
  byte *pbVar4;
  xmlChar *pxVar5;
  uint c;
  int iVar6;
  int iVar7;
  undefined8 in_RAX;
  xmlParserInputPtr pxVar8;
  xmlChar *pxVar9;
  byte *pbVar10;
  int iVar11;
  byte *name;
  undefined8 uStack_38;
  
  pxVar8 = ctxt->input;
  name = pxVar8->cur;
  pbVar4 = pxVar8->end;
  if ((byte)((*name & 0xdf) + 0xbf) < 0x1a) {
    if (pbVar4 <= name) goto LAB_0016ac6b;
  }
  else if (*name != 0x5f || pbVar4 <= name) goto LAB_0016ac6b;
  pbVar10 = name;
  iVar6 = 1;
  do {
    iVar11 = iVar6;
    pbVar10 = pbVar10 + 1;
    bVar3 = *pbVar10;
    if (((9 < (byte)(bVar3 - 0x30)) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf))) &&
       ((0x32 < bVar3 - 0x2d || ((0x4000000000003U >> ((ulong)(bVar3 - 0x2d) & 0x3f) & 1) == 0))))
    break;
    iVar6 = iVar11 + 1;
  } while (pbVar10 < pbVar4);
  if ('\0' < (char)bVar3 && pbVar10 < pbVar4) {
    if ((iVar11 < 0xc351) || ((ctxt->options & 0x80000) != 0)) {
      pxVar9 = xmlDictLookup(ctxt->dict,name,iVar11);
      pxVar8 = ctxt->input;
      pxVar8->cur = pbVar10;
      piVar1 = &pxVar8->col;
      *piVar1 = *piVar1 + iVar11;
      if (pxVar9 == (xmlChar *)0x0) {
        xmlErrMemory(ctxt,(char *)0x0);
        return (xmlChar *)0x0;
      }
      return pxVar9;
    }
LAB_0016ae2a:
    xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
    return (xmlChar *)0x0;
  }
LAB_0016ac6b:
  uStack_38 = in_RAX;
  if ((ctxt->progressive == 0) && ((long)pbVar4 - (long)name < 0xfa)) {
    xmlGROW(ctxt);
    pxVar8 = ctxt->input;
    name = pxVar8->cur;
  }
  pxVar9 = pxVar8->base;
  c = xmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
  if ((0x3e < c) || ((0x4000800100000000U >> ((ulong)c & 0x3f) & 1) == 0)) {
    iVar6 = xmlIsNameStartChar(ctxt,c);
    if (c == 0x3a) {
      return (xmlChar *)0x0;
    }
    if (iVar6 == 0) {
      return (xmlChar *)0x0;
    }
    iVar6 = 0;
    while( true ) {
      iVar11 = 0;
      do {
        if ((((c < 0x3f) && ((0x4000800100000000U >> ((ulong)c & 0x3f) & 1) != 0)) ||
            (iVar7 = xmlIsNameChar(ctxt,c), c == 0x3a)) || (iVar7 == 0)) {
          if ((iVar6 < 0xc351) || ((ctxt->options & 0x80000) != 0)) {
            pxVar9 = xmlDictLookup(ctxt->dict,ctxt->input->base + ((long)name - (long)pxVar9),iVar6)
            ;
            return pxVar9;
          }
          goto LAB_0016ae2a;
        }
        if (iVar11 < 0x65) {
          iVar11 = iVar11 + 1;
        }
        else {
          if ((50000 < iVar6) && ((ctxt->options & 0x80000) == 0)) goto LAB_0016ae2a;
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          iVar11 = 0;
          if (ctxt->instate == XML_PARSER_EOF) {
            return (xmlChar *)0x0;
          }
        }
        pxVar8 = ctxt->input;
        if (*pxVar8->cur == '\n') {
          pxVar8->line = pxVar8->line + 1;
          pxVar8->col = 1;
        }
        else {
          pxVar8->col = pxVar8->col + 1;
        }
        iVar6 = iVar6 + uStack_38._4_4_;
        pxVar8->cur = pxVar8->cur + uStack_38._4_4_;
        c = xmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
      } while (c != 0);
      pxVar8 = ctxt->input;
      pxVar5 = pxVar8->cur;
      pxVar8->cur = pxVar5 + -(long)uStack_38._4_4_;
      if ((ctxt->progressive == 0) &&
         ((long)pxVar8->end - (long)(pxVar5 + -(long)uStack_38._4_4_) < 0xfa)) {
        xmlGROW(ctxt);
      }
      if (ctxt->instate == XML_PARSER_EOF) break;
      ppxVar2 = &ctxt->input->cur;
      *ppxVar2 = *ppxVar2 + uStack_38._4_4_;
      c = xmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static const xmlChar *
xmlParseNCName(xmlParserCtxtPtr ctxt) {
    const xmlChar *in, *e;
    const xmlChar *ret;
    int count = 0;

#ifdef DEBUG
    nbParseNCName++;
#endif

    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->input->cur;
    e = ctxt->input->end;
    if ((((*in >= 0x61) && (*in <= 0x7A)) ||
	 ((*in >= 0x41) && (*in <= 0x5A)) ||
	 (*in == '_')) && (in < e)) {
	in++;
	while ((((*in >= 0x61) && (*in <= 0x7A)) ||
	        ((*in >= 0x41) && (*in <= 0x5A)) ||
	        ((*in >= 0x30) && (*in <= 0x39)) ||
	        (*in == '_') || (*in == '-') ||
	        (*in == '.')) && (in < e))
	    in++;
	if (in >= e)
	    goto complex;
	if ((*in > 0) && (*in < 0x80)) {
	    count = in - ctxt->input->cur;
            if ((count > XML_MAX_NAME_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
                return(NULL);
            }
	    ret = xmlDictLookup(ctxt->dict, ctxt->input->cur, count);
	    ctxt->input->cur = in;
	    ctxt->input->col += count;
	    if (ret == NULL) {
	        xmlErrMemory(ctxt, NULL);
	    }
	    return(ret);
	}
    }
complex:
    return(xmlParseNCNameComplex(ctxt));
}